

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3tokConnectMethod
              (sqlite3 *db,void *pHash,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Fts3HashElem *pFVar5;
  sqlite3_vtab *psVar6;
  char **ppcVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  sqlite3_module *psVar8;
  char *pcVar9;
  sqlite3 *psVar10;
  sqlite3_vtab **ppsVar11;
  char **ppcVar12;
  char *__s;
  ulong uVar13;
  uint uVar14;
  undefined8 *p;
  uint uVar15;
  sqlite3_tokenizer *pTok;
  sqlite3 *local_50;
  sqlite3_vtab **local_48;
  ulong local_40;
  Fts3Hash *local_38;
  
  local_50 = (sqlite3 *)0x0;
  pcVar9 = "CREATE TABLE x(input, token, start, end, position)";
  ppcVar7 = argv;
  ppsVar11 = ppVtab;
  ppcVar12 = pzErr;
  iVar1 = sqlite3_declare_vtab(db,"CREATE TABLE x(input, token, start, end, position)");
  if (iVar1 != 0) {
    return iVar1;
  }
  __s = "simple";
  p = (undefined8 *)0x0;
  uVar15 = argc - 3;
  local_38 = (Fts3Hash *)pHash;
  if (uVar15 == 0) {
LAB_001c8aa1:
    sVar4 = strlen(__s);
    pFVar5 = sqlite3Fts3HashFindElem(local_38,__s,(int)sVar4 + 1);
    if ((pFVar5 == (Fts3HashElem *)0x0) ||
       (psVar8 = (sqlite3_module *)pFVar5->data, psVar8 == (sqlite3_module *)0x0)) {
      pcVar9 = "unknown tokenizer: %s";
      psVar8 = (sqlite3_module *)0x0;
      sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer: %s",__s);
      iVar3 = 1;
      iVar1 = extraout_EDX_02;
    }
    else {
      pcVar9 = (char *)(p + 1);
      psVar10 = (sqlite3 *)0x0;
      if (4 < argc) {
        psVar10 = (sqlite3 *)(ulong)(argc - 4);
      }
      iVar3 = (*psVar8->xCreate)(psVar10,pcVar9,(int)&local_50,ppcVar7,ppsVar11,ppcVar12);
      iVar1 = extraout_EDX_01;
      if (iVar3 == 0) {
        iVar2 = sqlite3_initialize();
        iVar3 = 7;
        iVar1 = extraout_EDX_03;
        if ((iVar2 == 0) &&
           (psVar6 = (sqlite3_vtab *)sqlite3Malloc(0x28), iVar1 = extraout_EDX_04,
           psVar6 != (sqlite3_vtab *)0x0)) {
          psVar6->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar6->nRef = 0;
          psVar6->zErrMsg = (char *)0x0;
          psVar6[1].pModule = psVar8;
          *(sqlite3 **)&psVar6[1].nRef = local_50;
          *ppVtab = psVar6;
          iVar3 = 0;
          goto LAB_001c8b12;
        }
      }
    }
  }
  else {
    local_40 = (ulong)(uint)argc;
    if (3 < argc) {
      uVar13 = 0;
      do {
        sVar4 = strlen(argv[uVar13 + 3]);
        uVar14 = (int)p + (int)sVar4 + 1;
        p = (undefined8 *)(ulong)uVar14;
        uVar13 = uVar13 + 1;
      } while (uVar15 != uVar13);
      p = (undefined8 *)(long)(int)uVar14;
    }
    iVar2 = sqlite3_initialize();
    iVar3 = 7;
    iVar1 = extraout_EDX;
    if (iVar2 == 0) {
      local_48 = ppVtab;
      p = (undefined8 *)sqlite3Malloc((u64)(p + (int)uVar15));
      if (((int)local_40 < 4) || (p == (undefined8 *)0x0)) {
        iVar1 = extraout_EDX_00;
        if (p == (undefined8 *)0x0) goto LAB_001c89fb;
      }
      else {
        pcVar9 = (char *)(p + (int)uVar15);
        uVar13 = 0;
        do {
          sVar4 = strlen(argv[uVar13 + 3]);
          p[uVar13] = pcVar9;
          sVar4 = (size_t)((int)sVar4 + 1);
          memcpy(pcVar9,argv[uVar13 + 3],sVar4);
          sqlite3Fts3Dequote(pcVar9);
          pcVar9 = pcVar9 + sVar4;
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
      }
      argc = (int)local_40;
      ppVtab = local_48;
      if (argc < 4) {
        __s = "simple";
      }
      else {
        __s = (char *)*p;
      }
      goto LAB_001c8aa1;
    }
LAB_001c89fb:
    p = (undefined8 *)0x0;
    psVar8 = (sqlite3_module *)0x0;
  }
  if (local_50 != (sqlite3 *)0x0) {
    (*psVar8->xConnect)(local_50,pcVar9,iVar1,ppcVar7,ppsVar11,ppcVar12);
  }
LAB_001c8b12:
  sqlite3_free(p);
  return iVar3;
}

Assistant:

static int fts3tokConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pHash,                    /* Hash table of tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  Fts3tokTable *pTab = 0;
  const sqlite3_tokenizer_module *pMod = 0;
  sqlite3_tokenizer *pTok = 0;
  int rc;
  char **azDequote = 0;
  int nDequote;

  rc = sqlite3_declare_vtab(db, FTS3_TOK_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nDequote = argc-3;
  rc = fts3tokDequoteArray(nDequote, &argv[3], &azDequote);

  if( rc==SQLITE_OK ){
    const char *zModule;
    if( nDequote<1 ){
      zModule = "simple";
    }else{
      zModule = azDequote[0];
    }
    rc = fts3tokQueryTokenizer((Fts3Hash*)pHash, zModule, &pMod, pzErr);
  }

  assert( (rc==SQLITE_OK)==(pMod!=0) );
  if( rc==SQLITE_OK ){
    const char * const *azArg = (const char * const *)&azDequote[1];
    rc = pMod->xCreate((nDequote>1 ? nDequote-1 : 0), azArg, &pTok);
  }

  if( rc==SQLITE_OK ){
    pTab = (Fts3tokTable *)sqlite3_malloc(sizeof(Fts3tokTable));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    memset(pTab, 0, sizeof(Fts3tokTable));
    pTab->pMod = pMod;
    pTab->pTok = pTok;
    *ppVtab = &pTab->base;
  }else{
    if( pTok ){
      pMod->xDestroy(pTok);
    }
  }

  sqlite3_free(azDequote);
  return rc;
}